

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O2

bool __thiscall
ChainstateManager::AcceptBlock
          (ChainstateManager *this,shared_ptr<const_CBlock> *pblock,BlockValidationState *state,
          CBlockIndex **ppindex,bool fRequested,FlatFilePos *dbp,bool *fNewBlock,
          bool min_pow_checked)

{
  uint uVar1;
  int iVar2;
  CBlock *block;
  ValidationSignals *this_00;
  bool bVar3;
  int iVar4;
  CBlockIndex *pCVar5;
  CBlockIndex *pCVar6;
  base_uint<256U> *b;
  Chainstate *this_01;
  bool bVar7;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file;
  CBlockIndex *pindexDummy;
  FlatFilePos local_b8 [8];
  string local_78 [2];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  block = (pblock->super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (fNewBlock != (bool *)0x0) {
    *fNewBlock = false;
  }
  pindexDummy = (CBlockIndex *)0x0;
  if (ppindex == (CBlockIndex **)0x0) {
    ppindex = &pindexDummy;
  }
  bVar3 = AcceptBlockHeader(this,&block->super_CBlockHeader,state,ppindex,min_pow_checked);
  CheckBlockIndex(this);
  if (bVar3) {
    uVar1 = (*ppindex)->nStatus;
    pCVar5 = ActiveTip(this);
    if (pCVar5 == (CBlockIndex *)0x0) {
      bVar3 = false;
    }
    else {
      pCVar5 = *ppindex;
      pCVar6 = ActiveTip(this);
      bVar3 = operator>=(&(pCVar5->nChainWork).super_base_uint<256U>,
                         &(pCVar6->nChainWork).super_base_uint<256U>);
      bVar3 = !bVar3;
    }
    iVar2 = (*ppindex)->nHeight;
    iVar4 = ActiveHeight(this);
    bVar7 = true;
    if ((uVar1 & 8) != 0) goto LAB_0036637c;
    if (!fRequested) {
      pCVar5 = *ppindex;
      if ((bVar3 || pCVar5->nTx != 0) || (iVar4 + 0x120 < iVar2)) goto LAB_0036637c;
      b = &MinimumChainWork(this)->super_base_uint<256U>;
      bVar3 = ::operator<(&(pCVar5->nChainWork).super_base_uint<256U>,b);
      bVar7 = true;
      if (bVar3) goto LAB_0036637c;
    }
    bVar3 = CheckBlock(block,state,&((this->m_options).chainparams)->consensus,true,true);
    if ((bVar3) && (bVar3 = ContextualCheckBlock(block,state,this,(*ppindex)->pprev), bVar3)) {
      bVar3 = IsInitialBlockDownload(this);
      if (!bVar3) {
        pCVar5 = ActiveTip(this);
        if ((pCVar5 == (*ppindex)->pprev) &&
           (this_00 = (this->m_options).signals, this_00 != (ValidationSignals *)0x0)) {
          ValidationSignals::NewPoWValidBlock(this_00,*ppindex,pblock);
        }
      }
      if (fNewBlock != (bool *)0x0) {
        *fNewBlock = true;
      }
      if (dbp == (FlatFilePos *)0x0) {
        local_b8[0] = ::node::BlockManager::SaveBlockToDisk
                                (&this->m_blockman,block,(*ppindex)->nHeight);
        if (local_b8[0].nFile == -1) {
          tinyformat::format<char[12]>
                    (local_78,"%s: Failed to find position to write new block to disk",
                     (char (*) [12])"AcceptBlock");
          ValidationState<BlockValidationResult>::Error
                    (&state->super_ValidationState<BlockValidationResult>,local_78);
          goto LAB_00366370;
        }
      }
      else {
        local_b8[0] = *dbp;
        ::node::BlockManager::UpdateBlockInfo(&this->m_blockman,block,(*ppindex)->nHeight,local_b8);
      }
      ReceivedBlockTransactions(this,block,*ppindex,local_b8);
      this_01 = ActiveChainstate(this);
      Chainstate::FlushStateToDisk(this_01,state,NONE,0);
      CheckBlockIndex(this);
      bVar7 = true;
      goto LAB_0036637c;
    }
    if (((state->super_ValidationState<BlockValidationResult>).m_mode == M_INVALID) &&
       ((state->super_ValidationState<BlockValidationResult>).m_result != BLOCK_MUTATED)) {
      (*ppindex)->nStatus = (*ppindex)->nStatus | 0x20;
      std::
      _Rb_tree<CBlockIndex*,CBlockIndex*,std::_Identity<CBlockIndex*>,std::less<CBlockIndex*>,std::allocator<CBlockIndex*>>
      ::_M_insert_unique<CBlockIndex*const&>
                ((_Rb_tree<CBlockIndex*,CBlockIndex*,std::_Identity<CBlockIndex*>,std::less<CBlockIndex*>,std::allocator<CBlockIndex*>>
                  *)&(this->m_blockman).m_dirty_blockindex,ppindex);
    }
    ValidationState<BlockValidationResult>::ToString_abi_cxx11_
              (local_78,&state->super_ValidationState<BlockValidationResult>);
    logging_function._M_str = "AcceptBlock";
    logging_function._M_len = 0xb;
    source_file._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
    ;
    source_file._M_len = 0x5e;
    LogPrintFormatInternal<char[12],std::__cxx11::string>
              (logging_function,source_file,0x118d,ALL,Error,(ConstevalFormatString<2U>)0x688105,
               (char (*) [12])"AcceptBlock",local_78);
LAB_00366370:
    std::__cxx11::string::~string((string *)local_78);
  }
  bVar7 = false;
LAB_0036637c:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar7;
}

Assistant:

bool ChainstateManager::AcceptBlock(const std::shared_ptr<const CBlock>& pblock, BlockValidationState& state, CBlockIndex** ppindex, bool fRequested, const FlatFilePos* dbp, bool* fNewBlock, bool min_pow_checked)
{
    const CBlock& block = *pblock;

    if (fNewBlock) *fNewBlock = false;
    AssertLockHeld(cs_main);

    CBlockIndex *pindexDummy = nullptr;
    CBlockIndex *&pindex = ppindex ? *ppindex : pindexDummy;

    bool accepted_header{AcceptBlockHeader(block, state, &pindex, min_pow_checked)};
    CheckBlockIndex();

    if (!accepted_header)
        return false;

    // Check all requested blocks that we do not already have for validity and
    // save them to disk. Skip processing of unrequested blocks as an anti-DoS
    // measure, unless the blocks have more work than the active chain tip, and
    // aren't too far ahead of it, so are likely to be attached soon.
    bool fAlreadyHave = pindex->nStatus & BLOCK_HAVE_DATA;
    bool fHasMoreOrSameWork = (ActiveTip() ? pindex->nChainWork >= ActiveTip()->nChainWork : true);
    // Blocks that are too out-of-order needlessly limit the effectiveness of
    // pruning, because pruning will not delete block files that contain any
    // blocks which are too close in height to the tip.  Apply this test
    // regardless of whether pruning is enabled; it should generally be safe to
    // not process unrequested blocks.
    bool fTooFarAhead{pindex->nHeight > ActiveHeight() + int(MIN_BLOCKS_TO_KEEP)};

    // TODO: Decouple this function from the block download logic by removing fRequested
    // This requires some new chain data structure to efficiently look up if a
    // block is in a chain leading to a candidate for best tip, despite not
    // being such a candidate itself.
    // Note that this would break the getblockfrompeer RPC

    // TODO: deal better with return value and error conditions for duplicate
    // and unrequested blocks.
    if (fAlreadyHave) return true;
    if (!fRequested) {  // If we didn't ask for it:
        if (pindex->nTx != 0) return true;    // This is a previously-processed block that was pruned
        if (!fHasMoreOrSameWork) return true; // Don't process less-work chains
        if (fTooFarAhead) return true;        // Block height is too high

        // Protect against DoS attacks from low-work chains.
        // If our tip is behind, a peer could try to send us
        // low-work blocks on a fake chain that we would never
        // request; don't process these.
        if (pindex->nChainWork < MinimumChainWork()) return true;
    }

    const CChainParams& params{GetParams()};

    if (!CheckBlock(block, state, params.GetConsensus()) ||
        !ContextualCheckBlock(block, state, *this, pindex->pprev)) {
        if (state.IsInvalid() && state.GetResult() != BlockValidationResult::BLOCK_MUTATED) {
            pindex->nStatus |= BLOCK_FAILED_VALID;
            m_blockman.m_dirty_blockindex.insert(pindex);
        }
        LogError("%s: %s\n", __func__, state.ToString());
        return false;
    }

    // Header is valid/has work, merkle tree and segwit merkle tree are good...RELAY NOW
    // (but if it does not build on our best tip, let the SendMessages loop relay it)
    if (!IsInitialBlockDownload() && ActiveTip() == pindex->pprev && m_options.signals) {
        m_options.signals->NewPoWValidBlock(pindex, pblock);
    }

    // Write block to history file
    if (fNewBlock) *fNewBlock = true;
    try {
        FlatFilePos blockPos{};
        if (dbp) {
            blockPos = *dbp;
            m_blockman.UpdateBlockInfo(block, pindex->nHeight, blockPos);
        } else {
            blockPos = m_blockman.SaveBlockToDisk(block, pindex->nHeight);
            if (blockPos.IsNull()) {
                state.Error(strprintf("%s: Failed to find position to write new block to disk", __func__));
                return false;
            }
        }
        ReceivedBlockTransactions(block, pindex, blockPos);
    } catch (const std::runtime_error& e) {
        return FatalError(GetNotifications(), state, strprintf(_("System error while saving block to disk: %s"), e.what()));
    }

    // TODO: FlushStateToDisk() handles flushing of both block and chainstate
    // data, so we should move this to ChainstateManager so that we can be more
    // intelligent about how we flush.
    // For now, since FlushStateMode::NONE is used, all that can happen is that
    // the block files may be pruned, so we can just call this on one
    // chainstate (particularly if we haven't implemented pruning with
    // background validation yet).
    ActiveChainstate().FlushStateToDisk(state, FlushStateMode::NONE);

    CheckBlockIndex();

    return true;
}